

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxleastsqsc.hpp
# Opt level: O1

void __thiscall
soplex::
SPxLeastSqSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::scale(SPxLeastSqSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *lp,bool persistent)

{
  uint *puVar1;
  undefined1 uVar2;
  int pmax;
  uint uVar3;
  SPxOut *pSVar4;
  Tolerances *pTVar5;
  pointer pnVar6;
  undefined8 uVar7;
  Real RVar8;
  char cVar9;
  bool bVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined1 auVar16 [8];
  uint uVar17;
  uint uVar18;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  ulong uVar23;
  char *pcVar24;
  int iVar25;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *resnvec;
  uint uVar26;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var27;
  long lVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  qcurr;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_4;
  undefined8 local_1468;
  uint uStack_1460;
  undefined1 auStack_145c [4];
  undefined1 local_1458 [8];
  undefined1 auStack_1450 [5];
  undefined3 uStack_144b;
  undefined1 local_1448 [5];
  undefined3 uStack_1443;
  undefined1 local_1440 [4];
  undefined1 local_143c;
  undefined1 local_1438 [4];
  undefined1 auStack_1434 [4];
  int iStack_1430;
  undefined1 auStack_142c [4];
  Verbosity old_verbosity;
  uint uStack_1424;
  uint uStack_1420;
  uint uStack_141c;
  uint local_1418;
  uint uStack_1414;
  undefined8 uStack_1410;
  undefined8 local_1408;
  int local_1400;
  bool local_13fc;
  fpclass_type local_13f8;
  int32_t iStack_13f4;
  uint local_13f0 [2];
  uint auStack_13e8 [2];
  uint local_13e0 [2];
  uint auStack_13d8 [2];
  uint local_13d0 [2];
  int local_13c8;
  undefined1 local_13c4;
  fpclass_type local_13c0;
  int32_t iStack_13bc;
  uint local_13b8 [2];
  uint auStack_13b0 [2];
  uint local_13a8 [2];
  uint auStack_13a0 [2];
  uint local_1398 [2];
  int local_1390;
  undefined1 local_138c;
  fpclass_type local_1388;
  int32_t iStack_1384;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *rsccurr;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *csccurr;
  uint local_1368 [2];
  uint auStack_1360 [2];
  uint local_1358 [2];
  undefined8 uStack_1350;
  undefined8 local_1348;
  fpclass_type local_1338;
  int32_t iStack_1334;
  undefined8 uStack_1330;
  cpp_dec_float<50U,_int,_void> local_1328;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *rscprev;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *cscprev;
  shared_ptr<soplex::Tolerances> local_12e0;
  shared_ptr<soplex::Tolerances> local_12d0;
  shared_ptr<soplex::Tolerances> local_12c0;
  shared_ptr<soplex::Tolerances> local_12b0;
  shared_ptr<soplex::Tolerances> local_12a0;
  shared_ptr<soplex::Tolerances> local_1290;
  shared_ptr<soplex::Tolerances> local_1280;
  shared_ptr<soplex::Tolerances> local_1270;
  shared_ptr<soplex::Tolerances> local_1260;
  shared_ptr<soplex::Tolerances> local_1250;
  shared_ptr<soplex::Tolerances> local_1240;
  shared_ptr<soplex::Tolerances> local_1230;
  DataArray<int> *local_1220;
  DataArray<int> *local_1218;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_1210;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  tmpcols;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  resncols;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1168;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1128;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_10e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_10a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1068;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1028;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_fe8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_fa8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_f68;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_f28;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_ee8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_ea8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e68;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e28;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_de8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_da8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d68;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d28;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  smax;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  resnrows;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  rowlogs;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_c08;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_bc8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b88;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b48;
  SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  facnrows;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  colnnzinv;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  rownnzinv;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  tmprows;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  collogs;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  rowscale1;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_910;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_8c0;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_870;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_820;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_7d0;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_780;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  rowscale2;
  SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  facncols;
  SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_678;
  SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_610;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_5a8;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_558;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_508;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_4b8;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  colscale2;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  colscale1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_388;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_348;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_310;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_268;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_230;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1f8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1c0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_188;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_150;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_118;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined5 uStack_90;
  undefined3 uStack_8b;
  undefined5 uStack_88;
  undefined8 uStack_83;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined5 uStack_50;
  undefined3 uStack_4b;
  undefined5 uStack_48;
  undefined8 uStack_43;
  undefined8 local_38;
  
  pSVar4 = (this->
           super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).spxout;
  if ((pSVar4 != (SPxOut *)0x0) && (2 < (int)pSVar4->m_verbosity)) {
    old_verbosity = pSVar4->m_verbosity;
    facnrows.
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray._0_4_ = 3;
    (*pSVar4->_vptr_SPxOut[2])();
    pSVar4 = (this->
             super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).spxout;
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar4->m_streams[pSVar4->m_verbosity],"Least squares LP scaling",0x18);
    pcVar24 = "";
    if (persistent) {
      pcVar24 = " (persistent)";
    }
    lVar28 = 0xd;
    if (!persistent) {
      lVar28 = 0;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar4->m_streams[pSVar4->m_verbosity],pcVar24,lVar28);
    cVar9 = (char)pSVar4->m_streams[pSVar4->m_verbosity];
    std::ios::widen((char)*(undefined8 *)(*(long *)pSVar4->m_streams[pSVar4->m_verbosity] + -0x18) +
                    cVar9);
    std::ostream::put(cVar9);
    std::ostream::flush();
    pSVar4 = (this->
             super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).spxout;
    (*pSVar4->_vptr_SPxOut[2])(pSVar4,&old_verbosity);
  }
  (**(this->
     super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
     )._vptr_SPxScaler)(this,lp);
  pmax = (lp->
         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).
         super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         .set.thenum;
  lVar28 = (long)pmax;
  if (lVar28 < 1) {
    iVar25 = 0;
  }
  else {
    lVar22 = 0;
    iVar25 = 0;
    do {
      iVar25 = iVar25 + (lp->
                        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .set.theitem
                        [(lp->
                         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).
                         super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .set.thekey[lVar22].idx].data.
                        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .memused;
      lVar22 = lVar22 + 1;
    } while (lVar28 != lVar22);
  }
  if (iVar25 == 0) {
    (*(this->
      super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      )._vptr_SPxScaler[2])(this,lp);
    return;
  }
  uVar3 = (lp->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum;
  SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SVSetBase(&facnrows,uVar3,uVar3,1.1,1.2);
  SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SVSetBase(&facncols,pmax,pmax,1.1,1.2);
  local_1230.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->
       super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1230.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->
       super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if (local_1230.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_1230.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_1230.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_1230.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_1230.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SSVectorBase(&colscale1,pmax,&local_1230);
  if (local_1230.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1230.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_1240.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->
       super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1240.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->
       super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if (local_1240.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_1240.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_1240.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_1240.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_1240.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SSVectorBase(&colscale2,pmax,&local_1240);
  if (local_1240.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1240.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_1250.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->
       super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1250.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->
       super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if (local_1250.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_1250.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_1250.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_1250.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_1250.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SSVectorBase(&rowscale1,uVar3,&local_1250);
  if (local_1250.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1250.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_1260.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->
       super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1260.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->
       super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if (local_1260.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_1260.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_1260.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_1260.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_1260.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SSVectorBase(&rowscale2,uVar3,&local_1260);
  if (local_1260.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1260.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_1270.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->
       super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1270.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->
       super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if (local_1270.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_1270.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_1270.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_1270.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_1270.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SSVectorBase(&resnrows,uVar3,&local_1270);
  if (local_1270.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1270.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_1280.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->
       super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1280.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->
       super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if (local_1280.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_1280.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_1280.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_1280.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_1280.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SSVectorBase(&resncols,pmax,&local_1280);
  if (local_1280.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1280.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_1290.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->
       super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1290.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->
       super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if (local_1290.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_1290.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_1290.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_1290.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_1290.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SSVectorBase(&tmprows,uVar3,&local_1290);
  if (local_1290.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1290.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_12a0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->
       super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_12a0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->
       super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if (local_12a0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_12a0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_12a0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_12a0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_12a0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SSVectorBase(&tmpcols,pmax,&local_12a0);
  if (local_12a0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_12a0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_12b0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->
       super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_12b0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->
       super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if (local_12b0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_12b0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_12b0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_12b0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_12b0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SSVectorBase(&rowlogs,uVar3,&local_12b0);
  if (local_12b0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_12b0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_12c0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->
       super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_12c0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->
       super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if (local_12c0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_12c0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_12c0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_12c0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_12c0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SSVectorBase(&collogs,pmax,&local_12c0);
  if (local_12c0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_12c0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_12d0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->
       super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_12d0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->
       super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if (local_12d0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_12d0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_12d0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_12d0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_12d0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SSVectorBase(&rownnzinv,uVar3,&local_12d0);
  if (local_12d0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_12d0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_12e0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->
       super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_12e0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->
       super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if (local_12e0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_12e0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_12e0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_12e0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_12e0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SSVectorBase(&colnnzinv,pmax,&local_12e0);
  if (local_12e0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_12e0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  pSVar4 = (this->
           super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).spxout;
  rsccurr = &rowscale1;
  csccurr = &colscale1;
  rscprev = &rowscale2;
  cscprev = &colscale2;
  if ((pSVar4 != (SPxOut *)0x0) && (3 < (int)pSVar4->m_verbosity)) {
    old_verbosity = pSVar4->m_verbosity;
    result_2.m_backend.data._M_elems[0] = 4;
    (*pSVar4->_vptr_SPxOut[2])();
    pSVar4 = (this->
             super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).spxout;
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar4->m_streams[pSVar4->m_verbosity],"before scaling:",0xf);
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar4->m_streams[pSVar4->m_verbosity]," min= ",6);
    (*(lp->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[3])(&local_e0,lp,1);
    boost::multiprecision::operator<<(pSVar4->m_streams[pSVar4->m_verbosity],&local_e0);
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar4->m_streams[pSVar4->m_verbosity]," max= ",6);
    (*(lp->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[4])(&local_118,lp,1);
    boost::multiprecision::operator<<(pSVar4->m_streams[pSVar4->m_verbosity],&local_118);
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar4->m_streams[pSVar4->m_verbosity]," col-ratio= ",0xc);
    (*(this->
      super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      )._vptr_SPxScaler[0x33])(&local_150,this,lp);
    boost::multiprecision::operator<<(pSVar4->m_streams[pSVar4->m_verbosity],&local_150);
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar4->m_streams[pSVar4->m_verbosity]," row-ratio= ",0xc);
    (*(this->
      super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      )._vptr_SPxScaler[0x34])(&local_188,this,lp);
    boost::multiprecision::operator<<(pSVar4->m_streams[pSVar4->m_verbosity],&local_188);
    cVar9 = (char)pSVar4->m_streams[pSVar4->m_verbosity];
    std::ios::widen((char)*(undefined8 *)(*(long *)pSVar4->m_streams[pSVar4->m_verbosity] + -0x18) +
                    cVar9);
    std::ostream::put(cVar9);
    std::ostream::flush();
    pSVar4 = (this->
             super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).spxout;
    (*pSVar4->_vptr_SPxOut[2])(pSVar4,&old_verbosity);
  }
  smax.m_backend.fpclass = cpp_dec_float_finite;
  smax.m_backend.prec_elem = 10;
  smax.m_backend.data._M_elems[0] = 0;
  smax.m_backend.data._M_elems[1] = 0;
  smax.m_backend.data._M_elems[2] = 0;
  smax.m_backend.data._M_elems[3] = 0;
  smax.m_backend.data._M_elems[4] = 0;
  smax.m_backend.data._M_elems[5] = 0;
  smax.m_backend.data._M_elems._24_5_ = 0;
  smax.m_backend.data._M_elems[7]._1_3_ = 0;
  smax.m_backend.data._M_elems._32_5_ = 0;
  smax.m_backend._37_8_ = 0;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
            ((cpp_dec_float<50U,_int,_void> *)&old_verbosity,(long)iVar25,(type *)0x0);
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&smax.m_backend,(cpp_dec_float<50U,_int,_void> *)&old_verbosity,
             &(this->acrcydivisor).m_backend);
  qcurr.m_backend.fpclass = cpp_dec_float_finite;
  qcurr.m_backend.prec_elem = 10;
  qcurr.m_backend.data._M_elems[0] = 0;
  qcurr.m_backend.data._M_elems[1] = 0;
  qcurr.m_backend.data._M_elems[2] = 0;
  qcurr.m_backend.data._M_elems[3] = 0;
  qcurr.m_backend.data._M_elems[4] = 0;
  qcurr.m_backend.data._M_elems[5] = 0;
  qcurr.m_backend.data._M_elems._24_5_ = 0;
  qcurr.m_backend.data._M_elems[7]._1_3_ = 0;
  qcurr.m_backend.data._M_elems._32_5_ = 0;
  qcurr.m_backend.data._M_elems[9]._1_3_ = 0;
  qcurr.m_backend.exp = 0;
  qcurr.m_backend.neg = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&qcurr,1.0);
  local_1438 = (undefined1  [4])0x0;
  auStack_1434 = (undefined1  [4])0xa;
  local_1468._0_4_ = 0;
  local_1468._4_4_ = 0;
  uStack_1460 = 0;
  auStack_145c = (undefined1  [4])0x0;
  local_1458._0_4_ = 0;
  local_1458._4_4_ = 0;
  auStack_1450 = (undefined1  [5])0x0;
  uStack_144b = 0;
  local_1448 = (undefined1  [5])0x0;
  uStack_1443 = 0;
  local_1440 = (undefined1  [4])0x0;
  local_143c = 0;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_1468,0.0);
  lVar22 = 0x34;
  do {
    *(undefined8 *)(auStack_142c + lVar22) = 0xa00000000;
    *(undefined8 *)(auStack_145c + lVar22) = 0;
    *(undefined8 *)(auStack_1450 + lVar22 + -4) = 0;
    *(undefined8 *)(auStack_1450 + lVar22 + 4) = 0;
    *(undefined8 *)(local_1448 + lVar22 + 4) = 0;
    *(undefined8 *)(local_1440 + lVar22 + 1) = 0;
    *(undefined8 *)(local_1438 + lVar22 + 1) = 0;
    lVar22 = lVar22 + 0x38;
  } while (lVar22 != 0xdc);
  result_2.m_backend.fpclass = cpp_dec_float_finite;
  result_2.m_backend.prec_elem = 10;
  result_2.m_backend.data._M_elems[0] = 0;
  result_2.m_backend.data._M_elems[1] = 0;
  result_2.m_backend.data._M_elems[2] = 0;
  result_2.m_backend.data._M_elems[3] = 0;
  result_2.m_backend.data._M_elems[4] = 0;
  result_2.m_backend.data._M_elems[5] = 0;
  result_2.m_backend.data._M_elems._24_5_ = 0;
  result_2.m_backend.data._M_elems[7]._1_3_ = 0;
  result_2.m_backend.data._M_elems._32_5_ = 0;
  result_2.m_backend.data._M_elems[9]._1_3_ = 0;
  result_2.m_backend.exp = 0;
  result_2.m_backend.neg = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&result_2,0.0);
  lVar22 = 0x30;
  do {
    *(ulong *)(local_1438 + lVar22) =
         CONCAT35(result_2.m_backend.data._M_elems[9]._1_3_,result_2.m_backend.data._M_elems._32_5_)
    ;
    *(undefined8 *)(local_1448 + lVar22) = result_2.m_backend.data._M_elems._16_8_;
    *(ulong *)(local_1440 + lVar22) =
         CONCAT35(result_2.m_backend.data._M_elems[7]._1_3_,result_2.m_backend.data._M_elems._24_5_)
    ;
    *(undefined8 *)(auStack_1450 + lVar22 + -8) = result_2.m_backend.data._M_elems._0_8_;
    *(undefined8 *)(auStack_1450 + lVar22) = result_2.m_backend.data._M_elems._8_8_;
    *(int *)((long)&iStack_1430 + lVar22) = result_2.m_backend.exp;
    auStack_142c[lVar22] = result_2.m_backend.neg;
    *(undefined8 *)((long)&old_verbosity + lVar22) = result_2.m_backend._48_8_;
    lVar22 = lVar22 + 0x38;
  } while (lVar22 != 0xd8);
  pTVar5 = (this->
           super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var27 = (this->
            super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (p_Var27 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var27->_M_use_count = p_Var27->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var27->_M_use_count = p_Var27->_M_use_count + 1;
    }
  }
  RVar8 = Tolerances::epsilon(pTVar5);
  local_388.m_backend.fpclass = cpp_dec_float_finite;
  local_388.m_backend.prec_elem = 10;
  local_388.m_backend.data._M_elems[0] = 0;
  local_388.m_backend.data._M_elems[1] = 0;
  local_388.m_backend.data._M_elems[2] = 0;
  local_388.m_backend.data._M_elems[3] = 0;
  local_388.m_backend.data._M_elems[4] = 0;
  local_388.m_backend.data._M_elems[5] = 0;
  local_388.m_backend.data._M_elems._24_5_ = 0;
  local_388.m_backend.data._M_elems[7]._1_3_ = 0;
  local_388.m_backend.data._M_elems._32_5_ = 0;
  local_388.m_backend._37_8_ = 0;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_388,RVar8);
  initConstVecs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
            ((SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)lp,&facnrows,&rowlogs,&rownnzinv,&local_388);
  if (p_Var27 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var27);
  }
  pTVar5 = (this->
           super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var27 = (this->
            super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (p_Var27 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var27->_M_use_count = p_Var27->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var27->_M_use_count = p_Var27->_M_use_count + 1;
    }
  }
  RVar8 = Tolerances::epsilon(pTVar5);
  local_3c8.m_backend.fpclass = cpp_dec_float_finite;
  local_3c8.m_backend.prec_elem = 10;
  local_3c8.m_backend.data._M_elems[0] = 0;
  local_3c8.m_backend.data._M_elems[1] = 0;
  local_3c8.m_backend.data._M_elems[2] = 0;
  local_3c8.m_backend.data._M_elems[3] = 0;
  local_3c8.m_backend.data._M_elems[4] = 0;
  local_3c8.m_backend.data._M_elems[5] = 0;
  local_3c8.m_backend.data._M_elems._24_5_ = 0;
  local_3c8.m_backend.data._M_elems[7]._1_3_ = 0;
  local_3c8.m_backend.data._M_elems._32_5_ = 0;
  local_3c8.m_backend._37_8_ = 0;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_3c8,RVar8);
  initConstVecs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
            (&(lp->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ,&facncols,&collogs,&colnnzinv,&local_3c8);
  if (p_Var27 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var27);
  }
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::clear(&tmpcols);
  if (rowlogs.super_IdxSet.num == 1) {
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
    ::
    assign2product1<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
              ((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                *)&tmpcols,&facnrows,&rowlogs);
LAB_002ce909:
    tmpcols.setupStatus = true;
  }
  else {
    if ((tmpcols.setupStatus == true) &&
       ((double)facnrows.
                super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                .thesize * (double)rowlogs.super_IdxSet.num <=
        (double)facnrows.set.thenum *
        (double)((int)((ulong)((long)tmpcols.
                                     super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     .val.
                                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)tmpcols.
                                    super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    .val.
                                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x49249249)
        * 0.5)) {
      SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
      ::
      assign2productShort<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                ((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  *)&tmpcols,&facnrows,&rowlogs);
      goto LAB_002ce909;
    }
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
    ::
    assign2productFull<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
              ((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                *)&tmpcols,&facnrows,&rowlogs);
    tmpcols.setupStatus = false;
  }
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::operator-((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)&result_2,
              &collogs.
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ,&tmpcols.
                super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             );
  resncols.setupStatus = false;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::operator=(&resncols.
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ,(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)&result_2);
  if (result_2.m_backend.data._M_elems._0_8_ != 0) {
    operator_delete((void *)result_2.m_backend.data._M_elems._0_8_,
                    result_2.m_backend.data._M_elems._16_8_ - result_2.m_backend.data._M_elems._0_8_
                   );
  }
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setup(&resncols);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setup(&resnrows);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
  ::
  assignPWproduct4setup<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
            ((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
              *)&rowscale1,&rownnzinv,&rowlogs);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::operator=(&rowscale2,&rowscale1);
  pSVar19 = SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
            ::
            assignPWproduct4setup<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      ((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        *)&tmpcols,&colnnzinv,&resncols);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
  ::operator*((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)&local_1328,
              (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
               *)&resncols,pSVar19);
  if (this->maxrounds < 1) {
    uVar26 = 0;
  }
  else {
    uVar26 = 0;
    uVar11 = qcurr.m_backend.data._M_elems._0_8_;
    uVar12 = qcurr.m_backend.data._M_elems._8_8_;
    uVar13 = qcurr.m_backend.data._M_elems._16_8_;
    uVar14 = local_1468;
    uVar15 = _uStack_1460;
    auVar16 = local_1458;
    uVar7 = _local_1438;
    do {
      _local_1438 = uVar7;
      local_1458 = auVar16;
      _uStack_1460 = uVar15;
      local_1468 = uVar14;
      qcurr.m_backend.data._M_elems._16_8_ = uVar13;
      qcurr.m_backend.data._M_elems._8_8_ = uVar12;
      qcurr.m_backend.data._M_elems._0_8_ = uVar11;
      result_4.m_backend.data._M_elems._32_5_ = local_1328.data._M_elems._32_5_;
      result_4.m_backend.data._M_elems[9]._1_3_ = local_1328.data._M_elems[9]._1_3_;
      result_4.m_backend.data._M_elems[4] = local_1328.data._M_elems[4];
      result_4.m_backend.data._M_elems[5] = local_1328.data._M_elems[5];
      result_4.m_backend.data._M_elems._24_5_ = local_1328.data._M_elems._24_5_;
      result_4.m_backend.data._M_elems[7]._1_3_ = local_1328.data._M_elems[7]._1_3_;
      result_4.m_backend.data._M_elems[0] = local_1328.data._M_elems[0];
      result_4.m_backend.data._M_elems[1] = local_1328.data._M_elems[1];
      result_4.m_backend.data._M_elems[2] = local_1328.data._M_elems[2];
      result_4.m_backend.data._M_elems[3] = local_1328.data._M_elems[3];
      result_4.m_backend.exp = local_1328.exp;
      result_4.m_backend.neg = local_1328.neg;
      result_4.m_backend.fpclass = local_1328.fpclass;
      result_4.m_backend.prec_elem = local_1328.prec_elem;
      if (((local_1328.fpclass != cpp_dec_float_NaN) &&
          (smax.m_backend.fpclass != cpp_dec_float_NaN)) &&
         (iVar25 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&local_1328,&smax.m_backend), iVar25 < 0)) break;
      if ((uVar26 & 1) == 0) {
        if (uVar26 != 0) {
          SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::SSVectorBase(&local_780,&rownnzinv);
          SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::SSVectorBase(&local_7d0,&resnrows);
          local_d28.m_backend.data._M_elems[9]._1_3_ = qcurr.m_backend.data._M_elems[9]._1_3_;
          local_d28.m_backend.data._M_elems._32_5_ = qcurr.m_backend.data._M_elems._32_5_;
          local_d28.m_backend.data._M_elems[7]._1_3_ = qcurr.m_backend.data._M_elems[7]._1_3_;
          local_d28.m_backend.data._M_elems._24_5_ = qcurr.m_backend.data._M_elems._24_5_;
          local_d28.m_backend.data._M_elems[4] = qcurr.m_backend.data._M_elems[4];
          local_d28.m_backend.data._M_elems[5] = qcurr.m_backend.data._M_elems[5];
          local_d28.m_backend.data._M_elems[0] = qcurr.m_backend.data._M_elems[0];
          local_d28.m_backend.data._M_elems[1] = qcurr.m_backend.data._M_elems[1];
          local_d28.m_backend.data._M_elems[2] = qcurr.m_backend.data._M_elems[2];
          local_d28.m_backend.data._M_elems[3] = qcurr.m_backend.data._M_elems[3];
          local_d28.m_backend.exp = qcurr.m_backend.exp;
          local_d28.m_backend.neg = qcurr.m_backend.neg;
          local_d28.m_backend.fpclass = qcurr.m_backend.fpclass;
          local_d28.m_backend.prec_elem = qcurr.m_backend.prec_elem;
          local_d68.m_backend.data._M_elems[7]._1_3_ = uStack_144b;
          local_d68.m_backend.data._M_elems._24_5_ = auStack_1450;
          local_d68.m_backend.data._M_elems[0] = (uint)local_1468;
          local_d68.m_backend.data._M_elems[1] = local_1468._4_4_;
          local_d68.m_backend.data._M_elems[2] = uStack_1460;
          local_d68.m_backend.data._M_elems[3] = (uint)auStack_145c;
          local_d68.m_backend.data._M_elems[4] = local_1458._0_4_;
          local_d68.m_backend.data._M_elems[5] = local_1458._4_4_;
          local_d68.m_backend.data._M_elems[9]._1_3_ = uStack_1443;
          local_d68.m_backend.data._M_elems._32_5_ = local_1448;
          local_d68.m_backend.exp = (int)local_1440;
          local_d68.m_backend.neg = (bool)local_143c;
          local_d68.m_backend.fpclass = (fpclass_type)local_1438;
          local_d68.m_backend.prec_elem = (int32_t)auStack_1434;
          local_da8.m_backend.data._M_elems[0] = local_13f0[0];
          local_da8.m_backend.data._M_elems[1] = local_13f0[1];
          local_da8.m_backend.data._M_elems[2] = auStack_13e8[0];
          local_da8.m_backend.data._M_elems[3] = auStack_13e8[1];
          local_da8.m_backend.data._M_elems[4] = local_13e0[0];
          local_da8.m_backend.data._M_elems[5] = local_13e0[1];
          local_da8.m_backend.data._M_elems[6] = auStack_13d8[0];
          local_da8.m_backend.data._M_elems[7] = auStack_13d8[1];
          local_da8.m_backend.data._M_elems[8] = local_13d0[0];
          local_da8.m_backend.data._M_elems[9] = local_13d0[1];
          local_da8.m_backend.exp = local_13c8;
          local_da8.m_backend.neg = (bool)local_13c4;
          local_da8.m_backend.fpclass = local_13c0;
          local_da8.m_backend.prec_elem = iStack_13bc;
          local_de8.m_backend.data._M_elems[8] = local_1398[0];
          local_de8.m_backend.data._M_elems[9] = local_1398[1];
          local_de8.m_backend.data._M_elems[4] = local_13a8[0];
          local_de8.m_backend.data._M_elems[5] = local_13a8[1];
          local_de8.m_backend.data._M_elems[6] = auStack_13a0[0];
          local_de8.m_backend.data._M_elems[7] = auStack_13a0[1];
          local_de8.m_backend.data._M_elems[0] = local_13b8[0];
          local_de8.m_backend.data._M_elems[1] = local_13b8[1];
          local_de8.m_backend.data._M_elems[2] = auStack_13b0[0];
          local_de8.m_backend.data._M_elems[3] = auStack_13b0[1];
          local_de8.m_backend.exp = local_1390;
          local_de8.m_backend.neg = (bool)local_138c;
          local_de8.m_backend.fpclass = local_1388;
          local_de8.m_backend.prec_elem = iStack_1384;
          pTVar5 = (this->
                   super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          p_Var27 = (this->
                    super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
          if (p_Var27 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var27->_M_use_count = p_Var27->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var27->_M_use_count = p_Var27->_M_use_count + 1;
            }
          }
          RVar8 = Tolerances::epsilon(pTVar5);
          local_b48.m_backend.fpclass = cpp_dec_float_finite;
          local_b48.m_backend.prec_elem = 10;
          local_b48.m_backend.data._M_elems[0] = 0;
          local_b48.m_backend.data._M_elems[1] = 0;
          local_b48.m_backend.data._M_elems[2] = 0;
          local_b48.m_backend.data._M_elems[3] = 0;
          local_b48.m_backend.data._M_elems[4] = 0;
          local_b48.m_backend.data._M_elems[5] = 0;
          local_b48.m_backend.data._M_elems._24_5_ = 0;
          local_b48.m_backend.data._M_elems[7]._1_3_ = 0;
          local_b48.m_backend.data._M_elems._32_5_ = 0;
          local_b48.m_backend._37_8_ = 0;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_b48,RVar8);
          updateScale<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_780,&local_7d0,&tmprows,&rsccurr,&rscprev,&local_d28,&local_d68,
                     &local_da8,&local_de8,&local_b48);
          if (p_Var27 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var27);
          }
          SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::~SSVectorBase(&local_7d0);
          SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::~SSVectorBase(&local_780);
        }
        SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::SVSetBase(&local_610,&facncols);
        SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::SSVectorBase(&local_820,&resncols);
        local_e28.m_backend.data._M_elems[8] = (uint)local_1408;
        local_e28.m_backend.data._M_elems[9] = local_1408._4_4_;
        local_e28.m_backend.data._M_elems[4] = local_1418;
        local_e28.m_backend.data._M_elems[5] = uStack_1414;
        local_e28.m_backend.data._M_elems[6] = (uint)uStack_1410;
        local_e28.m_backend.data._M_elems[7] = uStack_1410._4_4_;
        local_e28.m_backend.data._M_elems[0] = old_verbosity;
        local_e28.m_backend.data._M_elems[1] = uStack_1424;
        local_e28.m_backend.data._M_elems[2] = uStack_1420;
        local_e28.m_backend.data._M_elems[3] = uStack_141c;
        local_e28.m_backend.exp = local_1400;
        local_e28.m_backend.neg = local_13fc;
        local_e28.m_backend.fpclass = local_13f8;
        local_e28.m_backend.prec_elem = iStack_13f4;
        local_e68.m_backend.data._M_elems[7]._1_3_ = qcurr.m_backend.data._M_elems[7]._1_3_;
        local_e68.m_backend.data._M_elems._24_5_ = qcurr.m_backend.data._M_elems._24_5_;
        local_e68.m_backend.data._M_elems[0] = qcurr.m_backend.data._M_elems[0];
        local_e68.m_backend.data._M_elems[1] = qcurr.m_backend.data._M_elems[1];
        local_e68.m_backend.data._M_elems[2] = qcurr.m_backend.data._M_elems[2];
        local_e68.m_backend.data._M_elems[3] = qcurr.m_backend.data._M_elems[3];
        local_e68.m_backend.data._M_elems[4] = qcurr.m_backend.data._M_elems[4];
        local_e68.m_backend.data._M_elems[5] = qcurr.m_backend.data._M_elems[5];
        local_e68.m_backend.data._M_elems[9]._1_3_ = qcurr.m_backend.data._M_elems[9]._1_3_;
        local_e68.m_backend.data._M_elems._32_5_ = qcurr.m_backend.data._M_elems._32_5_;
        local_e68.m_backend.exp = qcurr.m_backend.exp;
        local_e68.m_backend.neg = qcurr.m_backend.neg;
        local_e68.m_backend.fpclass = qcurr.m_backend.fpclass;
        local_e68.m_backend.prec_elem = qcurr.m_backend.prec_elem;
        pTVar5 = (this->
                 super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        p_Var27 = (this->
                  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
        if (p_Var27 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var27->_M_use_count = p_Var27->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var27->_M_use_count = p_Var27->_M_use_count + 1;
          }
        }
        RVar8 = Tolerances::epsilon(pTVar5);
        local_b88.m_backend.fpclass = cpp_dec_float_finite;
        local_b88.m_backend.prec_elem = 10;
        local_b88.m_backend.data._M_elems[0] = 0;
        local_b88.m_backend.data._M_elems[1] = 0;
        local_b88.m_backend.data._M_elems[2] = 0;
        local_b88.m_backend.data._M_elems[3] = 0;
        local_b88.m_backend.data._M_elems[4] = 0;
        local_b88.m_backend.data._M_elems[5] = 0;
        local_b88.m_backend.data._M_elems._24_5_ = 0;
        local_b88.m_backend.data._M_elems[7]._1_3_ = 0;
        local_b88.m_backend.data._M_elems._32_5_ = 0;
        local_b88.m_backend._37_8_ = 0;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_b88,RVar8);
        updateRes<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_610,&local_820,&resnrows,&tmprows,&local_e28,&local_e68,&local_b88);
        if (p_Var27 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var27);
        }
        SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::~SSVectorBase(&local_820);
        SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::~SVSetBase(&local_610);
        pSVar19 = SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  ::
                  assignPWproduct4setup<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                            ((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                              *)&tmprows,&resnrows,&rownnzinv);
        SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
        ::operator*((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)&result_2.m_backend,
                    (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                     *)&resnrows,pSVar19);
        local_1328.data._M_elems[9]._1_3_ = result_2.m_backend.data._M_elems[9]._1_3_;
        local_1328.data._M_elems._32_5_ = result_2.m_backend.data._M_elems._32_5_;
        local_1328.data._M_elems[7]._1_3_ = result_2.m_backend.data._M_elems[7]._1_3_;
        local_1328.data._M_elems._24_5_ = result_2.m_backend.data._M_elems._24_5_;
      }
      else {
        SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::SSVectorBase(&local_870,&colnnzinv);
        SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::SSVectorBase(&local_8c0,&resncols);
        local_ea8.m_backend.data._M_elems[9]._1_3_ = qcurr.m_backend.data._M_elems[9]._1_3_;
        local_ea8.m_backend.data._M_elems._32_5_ = qcurr.m_backend.data._M_elems._32_5_;
        local_ea8.m_backend.data._M_elems[7]._1_3_ = qcurr.m_backend.data._M_elems[7]._1_3_;
        local_ea8.m_backend.data._M_elems._24_5_ = qcurr.m_backend.data._M_elems._24_5_;
        local_ea8.m_backend.data._M_elems[4] = qcurr.m_backend.data._M_elems[4];
        local_ea8.m_backend.data._M_elems[5] = qcurr.m_backend.data._M_elems[5];
        local_ea8.m_backend.data._M_elems[0] = qcurr.m_backend.data._M_elems[0];
        local_ea8.m_backend.data._M_elems[1] = qcurr.m_backend.data._M_elems[1];
        local_ea8.m_backend.data._M_elems[2] = qcurr.m_backend.data._M_elems[2];
        local_ea8.m_backend.data._M_elems[3] = qcurr.m_backend.data._M_elems[3];
        local_ea8.m_backend.exp = qcurr.m_backend.exp;
        local_ea8.m_backend.neg = qcurr.m_backend.neg;
        local_ea8.m_backend.fpclass = qcurr.m_backend.fpclass;
        local_ea8.m_backend.prec_elem = qcurr.m_backend.prec_elem;
        local_ee8.m_backend.data._M_elems[7]._1_3_ = uStack_144b;
        local_ee8.m_backend.data._M_elems._24_5_ = auStack_1450;
        local_ee8.m_backend.data._M_elems[0] = (uint)local_1468;
        local_ee8.m_backend.data._M_elems[1] = local_1468._4_4_;
        local_ee8.m_backend.data._M_elems[2] = uStack_1460;
        local_ee8.m_backend.data._M_elems[3] = (uint)auStack_145c;
        local_ee8.m_backend.data._M_elems[4] = local_1458._0_4_;
        local_ee8.m_backend.data._M_elems[5] = local_1458._4_4_;
        local_ee8.m_backend.data._M_elems[9]._1_3_ = uStack_1443;
        local_ee8.m_backend.data._M_elems._32_5_ = local_1448;
        local_ee8.m_backend.exp = (int)local_1440;
        local_ee8.m_backend.neg = (bool)local_143c;
        local_ee8.m_backend.fpclass = (fpclass_type)local_1438;
        local_ee8.m_backend.prec_elem = (int32_t)auStack_1434;
        local_f28.m_backend.data._M_elems[0] = local_13f0[0];
        local_f28.m_backend.data._M_elems[1] = local_13f0[1];
        local_f28.m_backend.data._M_elems[2] = auStack_13e8[0];
        local_f28.m_backend.data._M_elems[3] = auStack_13e8[1];
        local_f28.m_backend.data._M_elems[4] = local_13e0[0];
        local_f28.m_backend.data._M_elems[5] = local_13e0[1];
        local_f28.m_backend.data._M_elems[6] = auStack_13d8[0];
        local_f28.m_backend.data._M_elems[7] = auStack_13d8[1];
        local_f28.m_backend.data._M_elems[8] = local_13d0[0];
        local_f28.m_backend.data._M_elems[9] = local_13d0[1];
        local_f28.m_backend.exp = local_13c8;
        local_f28.m_backend.neg = (bool)local_13c4;
        local_f28.m_backend.fpclass = local_13c0;
        local_f28.m_backend.prec_elem = iStack_13bc;
        local_f68.m_backend.data._M_elems[8] = local_1398[0];
        local_f68.m_backend.data._M_elems[9] = local_1398[1];
        local_f68.m_backend.data._M_elems[4] = local_13a8[0];
        local_f68.m_backend.data._M_elems[5] = local_13a8[1];
        local_f68.m_backend.data._M_elems[6] = auStack_13a0[0];
        local_f68.m_backend.data._M_elems[7] = auStack_13a0[1];
        local_f68.m_backend.data._M_elems[0] = local_13b8[0];
        local_f68.m_backend.data._M_elems[1] = local_13b8[1];
        local_f68.m_backend.data._M_elems[2] = auStack_13b0[0];
        local_f68.m_backend.data._M_elems[3] = auStack_13b0[1];
        local_f68.m_backend.exp = local_1390;
        local_f68.m_backend.neg = (bool)local_138c;
        local_f68.m_backend.fpclass = local_1388;
        local_f68.m_backend.prec_elem = iStack_1384;
        pTVar5 = (this->
                 super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        p_Var27 = (this->
                  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
        if (p_Var27 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var27->_M_use_count = p_Var27->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var27->_M_use_count = p_Var27->_M_use_count + 1;
          }
        }
        RVar8 = Tolerances::epsilon(pTVar5);
        local_bc8.m_backend.fpclass = cpp_dec_float_finite;
        local_bc8.m_backend.prec_elem = 10;
        local_bc8.m_backend.data._M_elems[0] = 0;
        local_bc8.m_backend.data._M_elems[1] = 0;
        local_bc8.m_backend.data._M_elems[2] = 0;
        local_bc8.m_backend.data._M_elems[3] = 0;
        local_bc8.m_backend.data._M_elems[4] = 0;
        local_bc8.m_backend.data._M_elems[5] = 0;
        local_bc8.m_backend.data._M_elems._24_5_ = 0;
        local_bc8.m_backend.data._M_elems[7]._1_3_ = 0;
        local_bc8.m_backend.data._M_elems._32_5_ = 0;
        local_bc8.m_backend._37_8_ = 0;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_bc8,RVar8);
        updateScale<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_870,&local_8c0,&tmpcols,&csccurr,&cscprev,&local_ea8,&local_ee8,&local_f28
                   ,&local_f68,&local_bc8);
        if (p_Var27 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var27);
        }
        SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::~SSVectorBase(&local_8c0);
        SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::~SSVectorBase(&local_870);
        SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::SVSetBase(&local_678,&facnrows);
        SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::SSVectorBase(&local_910,&resnrows);
        local_fa8.m_backend.data._M_elems[8] = (uint)local_1408;
        local_fa8.m_backend.data._M_elems[9] = local_1408._4_4_;
        local_fa8.m_backend.data._M_elems[4] = local_1418;
        local_fa8.m_backend.data._M_elems[5] = uStack_1414;
        local_fa8.m_backend.data._M_elems[6] = (uint)uStack_1410;
        local_fa8.m_backend.data._M_elems[7] = uStack_1410._4_4_;
        local_fa8.m_backend.data._M_elems[0] = old_verbosity;
        local_fa8.m_backend.data._M_elems[1] = uStack_1424;
        local_fa8.m_backend.data._M_elems[2] = uStack_1420;
        local_fa8.m_backend.data._M_elems[3] = uStack_141c;
        local_fa8.m_backend.exp = local_1400;
        local_fa8.m_backend.neg = local_13fc;
        local_fa8.m_backend.fpclass = local_13f8;
        local_fa8.m_backend.prec_elem = iStack_13f4;
        local_fe8.m_backend.data._M_elems[7]._1_3_ = qcurr.m_backend.data._M_elems[7]._1_3_;
        local_fe8.m_backend.data._M_elems._24_5_ = qcurr.m_backend.data._M_elems._24_5_;
        local_fe8.m_backend.data._M_elems[0] = qcurr.m_backend.data._M_elems[0];
        local_fe8.m_backend.data._M_elems[1] = qcurr.m_backend.data._M_elems[1];
        local_fe8.m_backend.data._M_elems[2] = qcurr.m_backend.data._M_elems[2];
        local_fe8.m_backend.data._M_elems[3] = qcurr.m_backend.data._M_elems[3];
        local_fe8.m_backend.data._M_elems[4] = qcurr.m_backend.data._M_elems[4];
        local_fe8.m_backend.data._M_elems[5] = qcurr.m_backend.data._M_elems[5];
        local_fe8.m_backend.data._M_elems[9]._1_3_ = qcurr.m_backend.data._M_elems[9]._1_3_;
        local_fe8.m_backend.data._M_elems._32_5_ = qcurr.m_backend.data._M_elems._32_5_;
        local_fe8.m_backend.exp = qcurr.m_backend.exp;
        local_fe8.m_backend.neg = qcurr.m_backend.neg;
        local_fe8.m_backend.fpclass = qcurr.m_backend.fpclass;
        local_fe8.m_backend.prec_elem = qcurr.m_backend.prec_elem;
        pTVar5 = (this->
                 super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        p_Var27 = (this->
                  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
        if (p_Var27 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var27->_M_use_count = p_Var27->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var27->_M_use_count = p_Var27->_M_use_count + 1;
          }
        }
        RVar8 = Tolerances::epsilon(pTVar5);
        local_c08.m_backend.fpclass = cpp_dec_float_finite;
        local_c08.m_backend.prec_elem = 10;
        local_c08.m_backend.data._M_elems[0] = 0;
        local_c08.m_backend.data._M_elems[1] = 0;
        local_c08.m_backend.data._M_elems[2] = 0;
        local_c08.m_backend.data._M_elems[3] = 0;
        local_c08.m_backend.data._M_elems[4] = 0;
        local_c08.m_backend.data._M_elems[5] = 0;
        local_c08.m_backend.data._M_elems._24_5_ = 0;
        local_c08.m_backend.data._M_elems[7]._1_3_ = 0;
        local_c08.m_backend.data._M_elems._32_5_ = 0;
        local_c08.m_backend._37_8_ = 0;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_c08,RVar8);
        updateRes<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_678,&local_910,&resncols,&tmpcols,&local_fa8,&local_fe8,&local_c08);
        if (p_Var27 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var27);
        }
        SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::~SSVectorBase(&local_910);
        SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::~SVSetBase(&local_678);
        pSVar19 = SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  ::
                  assignPWproduct4setup<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                            ((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                              *)&tmpcols,&resncols,&colnnzinv);
        SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
        ::operator*((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)&result_2.m_backend,
                    (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                     *)&resncols,pSVar19);
        local_1328.data._M_elems[9]._1_3_ = result_2.m_backend.data._M_elems[9]._1_3_;
        local_1328.data._M_elems._32_5_ = result_2.m_backend.data._M_elems._32_5_;
        local_1328.data._M_elems[7]._1_3_ = result_2.m_backend.data._M_elems[7]._1_3_;
        local_1328.data._M_elems._24_5_ = result_2.m_backend.data._M_elems._24_5_;
      }
      lVar22 = 0x70;
      do {
        *(undefined8 *)((long)&local_1408 + lVar22) = *(undefined8 *)(local_1440 + lVar22);
        uVar7 = *(undefined8 *)(auStack_1450 + lVar22 + -8);
        *(undefined8 *)((long)&stack0xffffffffffffebe8 + lVar22) =
             *(undefined8 *)(auStack_1450 + lVar22);
        *(undefined8 *)((long)&uStack_1410 + lVar22) = *(undefined8 *)(local_1448 + lVar22);
        *(undefined8 *)((long)&old_verbosity + lVar22) =
             *(undefined8 *)((long)&uStack_1460 + lVar22);
        *(undefined8 *)((long)&stack0xffffffffffffebe0 + lVar22) = uVar7;
        *(undefined4 *)(&stack0xffffffffffffec04 + lVar22 + -4) =
             *(undefined4 *)(local_1438 + lVar22);
        (&stack0xffffffffffffec04)[lVar22] = (bool)auStack_1434[lVar22];
        *(undefined8 *)((long)&stack0xffffffffffffec08 + lVar22) =
             *(undefined8 *)((long)&iStack_1430 + lVar22);
        lVar22 = lVar22 + -0x38;
      } while (lVar22 != 0);
      result_1.m_backend.data._M_elems._32_5_ = qcurr.m_backend.data._M_elems._32_5_;
      result_1.m_backend.data._M_elems[9]._1_3_ = qcurr.m_backend.data._M_elems[9]._1_3_;
      result_1.m_backend.data._M_elems[4] = qcurr.m_backend.data._M_elems[4];
      result_1.m_backend.data._M_elems[5] = qcurr.m_backend.data._M_elems[5];
      result_1.m_backend.data._M_elems._24_5_ = qcurr.m_backend.data._M_elems._24_5_;
      result_1.m_backend.data._M_elems[7]._1_3_ = qcurr.m_backend.data._M_elems[7]._1_3_;
      result_1.m_backend.data._M_elems[0] = qcurr.m_backend.data._M_elems[0];
      result_1.m_backend.data._M_elems[1] = qcurr.m_backend.data._M_elems[1];
      result_1.m_backend.data._M_elems[2] = qcurr.m_backend.data._M_elems[2];
      result_1.m_backend.data._M_elems[3] = qcurr.m_backend.data._M_elems[3];
      result_1.m_backend.exp = qcurr.m_backend.exp;
      result_1.m_backend.neg = qcurr.m_backend.neg;
      result_1.m_backend.fpclass = qcurr.m_backend.fpclass;
      result_1.m_backend.prec_elem = qcurr.m_backend.prec_elem;
      local_1328.data._M_elems._0_8_ = result_2.m_backend.data._M_elems._0_8_;
      local_1328.data._M_elems._8_8_ = result_2.m_backend.data._M_elems._8_8_;
      local_1328.data._M_elems._16_8_ = result_2.m_backend.data._M_elems._16_8_;
      local_1328.exp = result_2.m_backend.exp;
      local_1328.neg = result_2.m_backend.neg;
      local_1328._48_8_ = result_2.m_backend._48_8_;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                (&result_1.m_backend,&local_1328);
      result_2.m_backend.fpclass = cpp_dec_float_finite;
      result_2.m_backend.prec_elem = 10;
      result_2.m_backend.data._M_elems[0] = 0;
      result_2.m_backend.data._M_elems[1] = 0;
      result_2.m_backend.data._M_elems[2] = 0;
      result_2.m_backend.data._M_elems[3] = 0;
      result_2.m_backend.data._M_elems[4] = 0;
      result_2.m_backend.data._M_elems[5] = 0;
      result_2.m_backend.data._M_elems._24_5_ = 0;
      result_2.m_backend.data._M_elems[7]._1_3_ = 0;
      result_2.m_backend.data._M_elems._32_5_ = 0;
      result_2.m_backend.data._M_elems[9]._1_3_ = 0;
      result_2.m_backend.exp = 0;
      result_2.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&result_2.m_backend,&result_1.m_backend,&result_4.m_backend);
      bVar10 = qcurr.m_backend.neg;
      iVar25 = qcurr.m_backend.exp;
      local_1408._5_3_ = result_2.m_backend.data._M_elems[9]._1_3_;
      local_1408._0_5_ = result_2.m_backend.data._M_elems._32_5_;
      uStack_1410._5_3_ = result_2.m_backend.data._M_elems[7]._1_3_;
      uStack_1410._0_5_ = result_2.m_backend.data._M_elems._24_5_;
      local_1418 = result_2.m_backend.data._M_elems[4];
      uStack_1414 = result_2.m_backend.data._M_elems[5];
      old_verbosity = result_2.m_backend.data._M_elems[0];
      uStack_1424 = result_2.m_backend.data._M_elems[1];
      uStack_1420 = result_2.m_backend.data._M_elems[2];
      uStack_141c = result_2.m_backend.data._M_elems[3];
      local_1400 = result_2.m_backend.exp;
      local_13fc = result_2.m_backend.neg;
      local_13f8 = result_2.m_backend.fpclass;
      iStack_13f4 = result_2.m_backend.prec_elem;
      local_1348 = CONCAT35(qcurr.m_backend.data._M_elems[9]._1_3_,
                            qcurr.m_backend.data._M_elems._32_5_);
      uStack_1350 = CONCAT35(qcurr.m_backend.data._M_elems[7]._1_3_,
                             qcurr.m_backend.data._M_elems._24_5_);
      local_1358[0] = qcurr.m_backend.data._M_elems[4];
      local_1358[1] = qcurr.m_backend.data._M_elems[5];
      local_1368[0] = qcurr.m_backend.data._M_elems[0];
      local_1368[1] = qcurr.m_backend.data._M_elems[1];
      auStack_1360[0] = qcurr.m_backend.data._M_elems[2];
      auStack_1360[1] = qcurr.m_backend.data._M_elems[3];
      uVar2 = qcurr.m_backend.neg;
      local_1338 = qcurr.m_backend.fpclass;
      iStack_1334 = qcurr.m_backend.prec_elem;
      uStack_1330 = 0;
      result_1.m_backend.fpclass = cpp_dec_float_finite;
      result_1.m_backend.prec_elem = 10;
      result_1.m_backend.data._M_elems[0] = 0;
      result_1.m_backend.data._M_elems[1] = 0;
      result_1.m_backend.data._M_elems[2] = 0;
      result_1.m_backend.data._M_elems[3] = 0;
      result_1.m_backend.data._M_elems[4] = 0;
      result_1.m_backend.data._M_elems[5] = 0;
      result_1.m_backend.data._M_elems._24_5_ = 0;
      result_1.m_backend.data._M_elems[7]._1_3_ = 0;
      result_1.m_backend.data._M_elems._32_5_ = 0;
      result_1.m_backend.data._M_elems[9]._1_3_ = 0;
      result_1.m_backend.exp = 0;
      result_1.m_backend.neg = false;
      result_2.m_backend.fpclass = cpp_dec_float_finite;
      result_2.m_backend.prec_elem = 10;
      result_2.m_backend.data._M_elems[0] = 0;
      result_2.m_backend.data._M_elems[1] = 0;
      result_2.m_backend.data._M_elems[2] = 0;
      result_2.m_backend.data._M_elems[3] = 0;
      result_2.m_backend.data._M_elems[4] = 0;
      result_2.m_backend.data._M_elems[5] = 0;
      result_2.m_backend.data._M_elems._24_5_ = 0;
      result_2.m_backend.data._M_elems[7]._1_3_ = 0;
      result_2.m_backend.data._M_elems._32_5_ = 0;
      result_2.m_backend.data._M_elems[9]._1_3_ = 0;
      result_2.m_backend.exp = 0;
      result_2.m_backend.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&result_2.m_backend,1.0);
      result_1.m_backend.data._M_elems._32_5_ = SUB85(local_1408,0);
      result_1.m_backend.data._M_elems[9]._1_3_ = SUB83(local_1408,5);
      result_1.m_backend.data._M_elems[4] = local_1418;
      result_1.m_backend.data._M_elems[5] = uStack_1414;
      result_1.m_backend.data._M_elems._24_5_ = SUB85(uStack_1410,0);
      result_1.m_backend.data._M_elems[7]._1_3_ = SUB83(uStack_1410,5);
      result_1.m_backend.data._M_elems[0] = old_verbosity;
      result_1.m_backend.data._M_elems[1] = uStack_1424;
      result_1.m_backend.data._M_elems[2] = uStack_1420;
      result_1.m_backend.data._M_elems[3] = uStack_141c;
      result_1.m_backend.exp = local_1400;
      result_1.m_backend.neg = local_13fc;
      result_1.m_backend.fpclass = local_13f8;
      result_1.m_backend.prec_elem = iStack_13f4;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                (&result_1.m_backend,&result_2.m_backend);
      if (result_1.m_backend.data._M_elems[0] != 0 ||
          result_1.m_backend.fpclass != cpp_dec_float_finite) {
        result_1.m_backend.neg = (bool)(result_1.m_backend.neg ^ 1);
      }
      qcurr.m_backend.data._M_elems._32_5_ = result_1.m_backend.data._M_elems._32_5_;
      qcurr.m_backend.data._M_elems[9]._1_3_ = result_1.m_backend.data._M_elems[9]._1_3_;
      uVar11._0_4_ = result_1.m_backend.data._M_elems[0];
      uVar11._4_4_ = result_1.m_backend.data._M_elems[1];
      uVar12._0_4_ = result_1.m_backend.data._M_elems[2];
      uVar12._4_4_ = result_1.m_backend.data._M_elems[3];
      uVar13._0_4_ = result_1.m_backend.data._M_elems[4];
      uVar13._4_4_ = result_1.m_backend.data._M_elems[5];
      qcurr.m_backend.data._M_elems[4] = result_1.m_backend.data._M_elems[4];
      qcurr.m_backend.data._M_elems[5] = result_1.m_backend.data._M_elems[5];
      qcurr.m_backend.data._M_elems._24_5_ = result_1.m_backend.data._M_elems._24_5_;
      qcurr.m_backend.data._M_elems[7]._1_3_ = result_1.m_backend.data._M_elems[7]._1_3_;
      qcurr.m_backend.data._M_elems[0] = result_1.m_backend.data._M_elems[0];
      qcurr.m_backend.data._M_elems[1] = result_1.m_backend.data._M_elems[1];
      qcurr.m_backend.data._M_elems[2] = result_1.m_backend.data._M_elems[2];
      qcurr.m_backend.data._M_elems[3] = result_1.m_backend.data._M_elems[3];
      qcurr.m_backend.exp = result_1.m_backend.exp;
      qcurr.m_backend.neg = result_1.m_backend.neg;
      qcurr.m_backend.fpclass = result_1.m_backend.fpclass;
      qcurr.m_backend.prec_elem = result_1.m_backend.prec_elem;
      uVar14._0_4_ = local_1368[0];
      uVar14._4_4_ = local_1368[1];
      uVar15._0_4_ = auStack_1360[0];
      uVar15._4_4_ = auStack_1360[1];
      auVar16._0_4_ = local_1358[0];
      auVar16._4_4_ = local_1358[1];
      local_1468._0_4_ = local_1368[0];
      local_1468._4_4_ = local_1368[1];
      uStack_1460 = auStack_1360[0];
      auStack_145c = (undefined1  [4])auStack_1360[1];
      local_1458._0_4_ = local_1358[0];
      local_1458._4_4_ = local_1358[1];
      auStack_1450 = SUB85(uStack_1350,0);
      uStack_144b = (undefined3)((ulong)uStack_1350 >> 0x28);
      local_1448 = SUB85(local_1348,0);
      uStack_1443 = (undefined3)((ulong)local_1348 >> 0x28);
      local_1440 = (undefined1  [4])iVar25;
      local_143c = bVar10;
      uVar7._0_4_ = local_1338;
      uVar7._4_4_ = iStack_1334;
      local_1438 = (undefined1  [4])local_1338;
      auStack_1434 = (undefined1  [4])iStack_1334;
      uVar26 = uVar26 + 1;
    } while ((int)uVar26 < this->maxrounds);
  }
  if ((uVar26 & 1) == 0 && uVar26 != 0) {
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::SSVectorBase(&local_4b8,&colnnzinv);
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::SSVectorBase(&local_508,&resncols);
    local_1028.m_backend.data._M_elems[9]._1_3_ = uStack_1443;
    local_1028.m_backend.data._M_elems._32_5_ = local_1448;
    local_1028.m_backend.data._M_elems[7]._1_3_ = uStack_144b;
    local_1028.m_backend.data._M_elems._24_5_ = auStack_1450;
    local_1028.m_backend.data._M_elems[4] = local_1458._0_4_;
    local_1028.m_backend.data._M_elems[5] = local_1458._4_4_;
    local_1028.m_backend.data._M_elems[0] = (uint)local_1468;
    local_1028.m_backend.data._M_elems[1] = local_1468._4_4_;
    local_1028.m_backend.data._M_elems[2] = uStack_1460;
    local_1028.m_backend.data._M_elems[3] = (uint)auStack_145c;
    local_1028.m_backend.exp = (int)local_1440;
    local_1028.m_backend.neg = (bool)local_143c;
    local_1028.m_backend.fpclass = (fpclass_type)local_1438;
    local_1028.m_backend.prec_elem = (int32_t)auStack_1434;
    local_1068.m_backend.data._M_elems[0] = local_13f0[0];
    local_1068.m_backend.data._M_elems[1] = local_13f0[1];
    local_1068.m_backend.data._M_elems[2] = auStack_13e8[0];
    local_1068.m_backend.data._M_elems[3] = auStack_13e8[1];
    local_1068.m_backend.data._M_elems[4] = local_13e0[0];
    local_1068.m_backend.data._M_elems[5] = local_13e0[1];
    local_1068.m_backend.data._M_elems[6] = auStack_13d8[0];
    local_1068.m_backend.data._M_elems[7] = auStack_13d8[1];
    local_1068.m_backend.data._M_elems[8] = local_13d0[0];
    local_1068.m_backend.data._M_elems[9] = local_13d0[1];
    local_1068.m_backend.exp = local_13c8;
    local_1068.m_backend.neg = (bool)local_13c4;
    local_1068.m_backend.fpclass = local_13c0;
    local_1068.m_backend.prec_elem = iStack_13bc;
    local_10a8.m_backend.data._M_elems[0] = local_13b8[0];
    local_10a8.m_backend.data._M_elems[1] = local_13b8[1];
    local_10a8.m_backend.data._M_elems[2] = auStack_13b0[0];
    local_10a8.m_backend.data._M_elems[3] = auStack_13b0[1];
    local_10a8.m_backend.data._M_elems[4] = local_13a8[0];
    local_10a8.m_backend.data._M_elems[5] = local_13a8[1];
    local_10a8.m_backend.data._M_elems[6] = auStack_13a0[0];
    local_10a8.m_backend.data._M_elems[7] = auStack_13a0[1];
    local_10a8.m_backend.data._M_elems[8] = local_1398[0];
    local_10a8.m_backend.data._M_elems[9] = local_1398[1];
    local_10a8.m_backend.exp = local_1390;
    local_10a8.m_backend.neg = (bool)local_138c;
    local_10a8.m_backend.fpclass = local_1388;
    local_10a8.m_backend.prec_elem = iStack_1384;
    pTVar5 = (this->
             super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    p_Var27 = (this->
              super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    if (p_Var27 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var27->_M_use_count = p_Var27->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var27->_M_use_count = p_Var27->_M_use_count + 1;
      }
    }
    RVar8 = Tolerances::epsilon(pTVar5);
    local_38 = 0xa00000000;
    local_68 = 0;
    uStack_60 = 0;
    local_58 = 0;
    uStack_50 = 0;
    uStack_4b = 0;
    uStack_48 = 0;
    uStack_43 = 0;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_68,RVar8);
    pSVar19 = &local_4b8;
    resnvec = &local_508;
    updateScaleFinal<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (pSVar19,resnvec,&tmpcols,&csccurr,&cscprev,&local_1028,&local_1068,&local_10a8,
               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&local_68);
  }
  else {
    if (uVar26 == 0) goto LAB_002cfbcc;
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::SSVectorBase(&local_558,&rownnzinv);
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::SSVectorBase(&local_5a8,&resnrows);
    local_10e8.m_backend.data._M_elems[9]._1_3_ = uStack_1443;
    local_10e8.m_backend.data._M_elems._32_5_ = local_1448;
    local_10e8.m_backend.data._M_elems[7]._1_3_ = uStack_144b;
    local_10e8.m_backend.data._M_elems._24_5_ = auStack_1450;
    local_10e8.m_backend.data._M_elems[4] = local_1458._0_4_;
    local_10e8.m_backend.data._M_elems[5] = local_1458._4_4_;
    local_10e8.m_backend.data._M_elems[0] = (uint)local_1468;
    local_10e8.m_backend.data._M_elems[1] = local_1468._4_4_;
    local_10e8.m_backend.data._M_elems[2] = uStack_1460;
    local_10e8.m_backend.data._M_elems[3] = (uint)auStack_145c;
    local_10e8.m_backend.exp = (int)local_1440;
    local_10e8.m_backend.neg = (bool)local_143c;
    local_10e8.m_backend.fpclass = (fpclass_type)local_1438;
    local_10e8.m_backend.prec_elem = (int32_t)auStack_1434;
    local_1128.m_backend.data._M_elems[0] = local_13f0[0];
    local_1128.m_backend.data._M_elems[1] = local_13f0[1];
    local_1128.m_backend.data._M_elems[2] = auStack_13e8[0];
    local_1128.m_backend.data._M_elems[3] = auStack_13e8[1];
    local_1128.m_backend.data._M_elems[4] = local_13e0[0];
    local_1128.m_backend.data._M_elems[5] = local_13e0[1];
    local_1128.m_backend.data._M_elems[6] = auStack_13d8[0];
    local_1128.m_backend.data._M_elems[7] = auStack_13d8[1];
    local_1128.m_backend.data._M_elems[8] = local_13d0[0];
    local_1128.m_backend.data._M_elems[9] = local_13d0[1];
    local_1128.m_backend.exp = local_13c8;
    local_1128.m_backend.neg = (bool)local_13c4;
    local_1128.m_backend.fpclass = local_13c0;
    local_1128.m_backend.prec_elem = iStack_13bc;
    local_1168.m_backend.data._M_elems[0] = local_13b8[0];
    local_1168.m_backend.data._M_elems[1] = local_13b8[1];
    local_1168.m_backend.data._M_elems[2] = auStack_13b0[0];
    local_1168.m_backend.data._M_elems[3] = auStack_13b0[1];
    local_1168.m_backend.data._M_elems[4] = local_13a8[0];
    local_1168.m_backend.data._M_elems[5] = local_13a8[1];
    local_1168.m_backend.data._M_elems[6] = auStack_13a0[0];
    local_1168.m_backend.data._M_elems[7] = auStack_13a0[1];
    local_1168.m_backend.data._M_elems[8] = local_1398[0];
    local_1168.m_backend.data._M_elems[9] = local_1398[1];
    local_1168.m_backend.exp = local_1390;
    local_1168.m_backend.neg = (bool)local_138c;
    local_1168.m_backend.fpclass = local_1388;
    local_1168.m_backend.prec_elem = iStack_1384;
    pTVar5 = (this->
             super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    p_Var27 = (this->
              super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    if (p_Var27 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var27->_M_use_count = p_Var27->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var27->_M_use_count = p_Var27->_M_use_count + 1;
      }
    }
    RVar8 = Tolerances::epsilon(pTVar5);
    local_78 = 0xa00000000;
    local_a8 = 0;
    uStack_a0 = 0;
    local_98 = 0;
    uStack_90 = 0;
    uStack_8b = 0;
    uStack_88 = 0;
    uStack_83 = 0;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_a8,RVar8);
    pSVar19 = &local_558;
    resnvec = &local_5a8;
    updateScaleFinal<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (pSVar19,resnvec,&tmprows,&rsccurr,&rscprev,&local_10e8,&local_1128,&local_1168,
               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&local_a8);
  }
  if (p_Var27 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var27);
  }
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::~SSVectorBase(resnvec);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::~SSVectorBase(pSVar19);
LAB_002cfbcc:
  pSVar19 = rsccurr;
  local_1210 = csccurr;
  local_1218 = (this->
               super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).m_activeColscaleExp;
  if (0 < (int)uVar3) {
    local_1220 = (this->
                 super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).m_activeRowscaleExp;
    lVar22 = 0xc;
    uVar23 = 0;
    do {
      pnVar6 = (pSVar19->
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_1348 = *(undefined8 *)((pnVar6->m_backend).data._M_elems + lVar22 + -4);
      puVar1 = (pnVar6->m_backend).data._M_elems + lVar22 + -0xc;
      local_1368 = *(uint (*) [2])puVar1;
      auStack_1360 = *(uint (*) [2])(puVar1 + 2);
      puVar1 = (pnVar6->m_backend).data._M_elems + lVar22 + -8;
      local_1358 = *(uint (*) [2])puVar1;
      uStack_1350 = *(undefined8 *)(puVar1 + 2);
      uVar26 = (pnVar6->m_backend).data._M_elems[lVar22 + -2];
      uVar18 = (pnVar6->m_backend).data._M_elems[lVar22 + -1];
      puVar1 = (pnVar6->m_backend).data._M_elems + lVar22;
      local_1338 = puVar1[0];
      iStack_1334 = puVar1[1];
      uStack_1330 = 0;
      pnVar6 = (pSVar19->
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar7 = *(undefined8 *)((pnVar6->m_backend).data._M_elems + lVar22 + -4);
      result_1.m_backend.data._M_elems._32_5_ = SUB85(uVar7,0);
      result_1.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
      puVar1 = (pnVar6->m_backend).data._M_elems + lVar22 + -0xc;
      result_1.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar1;
      result_1.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (pnVar6->m_backend).data._M_elems + lVar22 + -8;
      result_1.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      uVar7 = *(undefined8 *)(puVar1 + 2);
      result_1.m_backend.data._M_elems._24_5_ = SUB85(uVar7,0);
      result_1.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
      result_1.m_backend.exp = (pnVar6->m_backend).data._M_elems[lVar22 + -2];
      result_1.m_backend.neg = SUB41((pnVar6->m_backend).data._M_elems[lVar22 + -1],0);
      puVar1 = (pnVar6->m_backend).data._M_elems + lVar22;
      result_1.m_backend.fpclass = puVar1[0];
      result_1.m_backend.prec_elem = puVar1[1];
      uVar29 = 0;
      uVar30 = 0xbfe00000;
      if (result_1.m_backend.fpclass != cpp_dec_float_NaN) {
        result_2.m_backend.fpclass = cpp_dec_float_finite;
        result_2.m_backend.prec_elem = 10;
        result_2.m_backend.data._M_elems[0] = 0;
        result_2.m_backend.data._M_elems[1] = 0;
        result_2.m_backend.data._M_elems[2] = 0;
        result_2.m_backend.data._M_elems[3] = 0;
        result_2.m_backend.data._M_elems[4] = 0;
        result_2.m_backend.data._M_elems[5] = 0;
        result_2.m_backend.data._M_elems._24_5_ = 0;
        result_2.m_backend.data._M_elems[7]._1_3_ = 0;
        result_2.m_backend.data._M_elems._32_5_ = 0;
        result_2.m_backend.data._M_elems[9]._1_3_ = 0;
        result_2.m_backend.exp = 0;
        result_2.m_backend.neg = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&result_2.m_backend,0.0);
        uVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&result_1.m_backend,&result_2.m_backend);
        uVar29 = (undefined4)*(undefined8 *)(&DAT_006011c0 + (ulong)(~uVar17 >> 0x1f) * 8);
        uVar30 = (undefined4)
                 ((ulong)*(undefined8 *)(&DAT_006011c0 + (ulong)(~uVar17 >> 0x1f) * 8) >> 0x20);
      }
      result_4.m_backend.fpclass = cpp_dec_float_finite;
      result_4.m_backend.prec_elem = 10;
      result_4.m_backend.data._M_elems[0] = 0;
      result_4.m_backend.data._M_elems[1] = 0;
      result_4.m_backend.data._M_elems[2] = 0;
      result_4.m_backend.data._M_elems[3] = 0;
      result_4.m_backend.data._M_elems[4] = 0;
      result_4.m_backend.data._M_elems[5] = 0;
      result_4.m_backend.data._M_elems._24_5_ = 0;
      result_4.m_backend.data._M_elems[7]._1_3_ = 0;
      result_4.m_backend.data._M_elems._32_5_ = 0;
      result_4.m_backend.data._M_elems[9]._1_3_ = 0;
      result_4.m_backend.exp = 0;
      result_4.m_backend.neg = false;
      result_2.m_backend.fpclass = cpp_dec_float_finite;
      result_2.m_backend.prec_elem = 10;
      result_2.m_backend.data._M_elems[0] = 0;
      result_2.m_backend.data._M_elems[1] = 0;
      result_2.m_backend.data._M_elems[2] = 0;
      result_2.m_backend.data._M_elems[3] = 0;
      result_2.m_backend.data._M_elems[4] = 0;
      result_2.m_backend.data._M_elems[5] = 0;
      result_2.m_backend.data._M_elems._24_5_ = 0;
      result_2.m_backend.data._M_elems[7]._1_3_ = 0;
      result_2.m_backend.data._M_elems._32_5_ = 0;
      result_2.m_backend.data._M_elems[9]._1_3_ = 0;
      result_2.m_backend.exp = 0;
      result_2.m_backend.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&result_2.m_backend,(double)CONCAT44(uVar30,uVar29))
      ;
      result_4.m_backend.data._M_elems._32_5_ = SUB85(local_1348,0);
      result_4.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)local_1348 >> 0x28);
      result_4.m_backend.data._M_elems[4] = local_1358[0];
      result_4.m_backend.data._M_elems[5] = local_1358[1];
      result_4.m_backend.data._M_elems._24_5_ = SUB85(uStack_1350,0);
      result_4.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uStack_1350 >> 0x28);
      result_4.m_backend.data._M_elems[0] = local_1368[0];
      result_4.m_backend.data._M_elems[1] = local_1368[1];
      result_4.m_backend.data._M_elems[2] = auStack_1360[0];
      result_4.m_backend.data._M_elems[3] = auStack_1360[1];
      result_4.m_backend.fpclass = local_1338;
      result_4.m_backend.prec_elem = iStack_1334;
      result_4.m_backend.exp = uVar26;
      result_4.m_backend.neg = (bool)(char)uVar18;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                (&result_4.m_backend,&result_2.m_backend);
      lVar20 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
               extract_signed_long_long(&result_4.m_backend);
      if (lVar20 < -0x7fffffff) {
        lVar20 = -0x80000000;
      }
      if (0x7ffffffe < lVar20) {
        lVar20 = 0x7fffffff;
      }
      local_1220->data[uVar23] = -(int)lVar20;
      uVar23 = uVar23 + 1;
      lVar22 = lVar22 + 0xe;
    } while (uVar3 != uVar23);
  }
  if (0 < pmax) {
    lVar22 = 0xc;
    lVar20 = 0;
    do {
      pnVar6 = (local_1210->
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_1348 = *(undefined8 *)((pnVar6->m_backend).data._M_elems + lVar22 + -4);
      puVar1 = (pnVar6->m_backend).data._M_elems + lVar22 + -0xc;
      local_1368 = *(uint (*) [2])puVar1;
      auStack_1360 = *(uint (*) [2])(puVar1 + 2);
      puVar1 = (pnVar6->m_backend).data._M_elems + lVar22 + -8;
      local_1358 = *(uint (*) [2])puVar1;
      uStack_1350 = *(undefined8 *)(puVar1 + 2);
      uVar3 = (pnVar6->m_backend).data._M_elems[lVar22 + -2];
      uVar26 = (pnVar6->m_backend).data._M_elems[lVar22 + -1];
      puVar1 = (pnVar6->m_backend).data._M_elems + lVar22;
      local_1338 = puVar1[0];
      iStack_1334 = puVar1[1];
      uStack_1330 = 0;
      pnVar6 = (local_1210->
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar7 = *(undefined8 *)((pnVar6->m_backend).data._M_elems + lVar22 + -4);
      result_1.m_backend.data._M_elems._32_5_ = SUB85(uVar7,0);
      result_1.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
      puVar1 = (pnVar6->m_backend).data._M_elems + lVar22 + -0xc;
      result_1.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar1;
      result_1.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (pnVar6->m_backend).data._M_elems + lVar22 + -8;
      result_1.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      uVar7 = *(undefined8 *)(puVar1 + 2);
      result_1.m_backend.data._M_elems._24_5_ = SUB85(uVar7,0);
      result_1.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
      result_1.m_backend.exp = (pnVar6->m_backend).data._M_elems[lVar22 + -2];
      result_1.m_backend.neg = SUB41((pnVar6->m_backend).data._M_elems[lVar22 + -1],0);
      puVar1 = (pnVar6->m_backend).data._M_elems + lVar22;
      result_1.m_backend.fpclass = puVar1[0];
      result_1.m_backend.prec_elem = puVar1[1];
      uVar29 = 0;
      uVar30 = 0xbfe00000;
      if (result_1.m_backend.fpclass != cpp_dec_float_NaN) {
        result_2.m_backend.fpclass = cpp_dec_float_finite;
        result_2.m_backend.prec_elem = 10;
        result_2.m_backend.data._M_elems[0] = 0;
        result_2.m_backend.data._M_elems[1] = 0;
        result_2.m_backend.data._M_elems[2] = 0;
        result_2.m_backend.data._M_elems[3] = 0;
        result_2.m_backend.data._M_elems[4] = 0;
        result_2.m_backend.data._M_elems[5] = 0;
        result_2.m_backend.data._M_elems._24_5_ = 0;
        result_2.m_backend.data._M_elems[7]._1_3_ = 0;
        result_2.m_backend.data._M_elems._32_5_ = 0;
        result_2.m_backend.data._M_elems[9]._1_3_ = 0;
        result_2.m_backend.exp = 0;
        result_2.m_backend.neg = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&result_2.m_backend,0.0);
        uVar18 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&result_1.m_backend,&result_2.m_backend);
        uVar29 = (undefined4)*(undefined8 *)(&DAT_006011c0 + (ulong)(~uVar18 >> 0x1f) * 8);
        uVar30 = (undefined4)
                 ((ulong)*(undefined8 *)(&DAT_006011c0 + (ulong)(~uVar18 >> 0x1f) * 8) >> 0x20);
      }
      result_4.m_backend.fpclass = cpp_dec_float_finite;
      result_4.m_backend.prec_elem = 10;
      result_4.m_backend.data._M_elems[0] = 0;
      result_4.m_backend.data._M_elems[1] = 0;
      result_4.m_backend.data._M_elems[2] = 0;
      result_4.m_backend.data._M_elems[3] = 0;
      result_4.m_backend.data._M_elems[4] = 0;
      result_4.m_backend.data._M_elems[5] = 0;
      result_4.m_backend.data._M_elems._24_5_ = 0;
      result_4.m_backend.data._M_elems[7]._1_3_ = 0;
      result_4.m_backend.data._M_elems._32_5_ = 0;
      result_4.m_backend.data._M_elems[9]._1_3_ = 0;
      result_4.m_backend.exp = 0;
      result_4.m_backend.neg = false;
      result_2.m_backend.fpclass = cpp_dec_float_finite;
      result_2.m_backend.prec_elem = 10;
      result_2.m_backend.data._M_elems[0] = 0;
      result_2.m_backend.data._M_elems[1] = 0;
      result_2.m_backend.data._M_elems[2] = 0;
      result_2.m_backend.data._M_elems[3] = 0;
      result_2.m_backend.data._M_elems[4] = 0;
      result_2.m_backend.data._M_elems[5] = 0;
      result_2.m_backend.data._M_elems._24_5_ = 0;
      result_2.m_backend.data._M_elems[7]._1_3_ = 0;
      result_2.m_backend.data._M_elems._32_5_ = 0;
      result_2.m_backend.data._M_elems[9]._1_3_ = 0;
      result_2.m_backend.exp = 0;
      result_2.m_backend.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&result_2.m_backend,(double)CONCAT44(uVar30,uVar29))
      ;
      result_4.m_backend.data._M_elems._32_5_ = SUB85(local_1348,0);
      result_4.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)local_1348 >> 0x28);
      result_4.m_backend.data._M_elems[4] = local_1358[0];
      result_4.m_backend.data._M_elems[5] = local_1358[1];
      result_4.m_backend.data._M_elems._24_5_ = SUB85(uStack_1350,0);
      result_4.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uStack_1350 >> 0x28);
      result_4.m_backend.data._M_elems[0] = local_1368[0];
      result_4.m_backend.data._M_elems[1] = local_1368[1];
      result_4.m_backend.data._M_elems[2] = auStack_1360[0];
      result_4.m_backend.data._M_elems[3] = auStack_1360[1];
      result_4.m_backend.fpclass = local_1338;
      result_4.m_backend.prec_elem = iStack_1334;
      result_4.m_backend.exp = uVar3;
      result_4.m_backend.neg = (bool)(char)uVar26;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                (&result_4.m_backend,&result_2.m_backend);
      lVar21 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
               extract_signed_long_long(&result_4.m_backend);
      if (lVar21 < -0x7fffffff) {
        lVar21 = -0x80000000;
      }
      if (0x7ffffffe < lVar21) {
        lVar21 = 0x7fffffff;
      }
      local_1218->data[lVar20] = -(int)lVar21;
      lVar20 = lVar20 + 1;
      lVar22 = lVar22 + 0xe;
    } while (lVar28 != lVar20);
  }
  (*(this->
    super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    )._vptr_SPxScaler[2])(this,lp);
  pSVar4 = (this->
           super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).spxout;
  if ((pSVar4 != (SPxOut *)0x0) && (4 < (int)pSVar4->m_verbosity)) {
    result_2.m_backend.data._M_elems[0] = pSVar4->m_verbosity;
    result_4.m_backend.data._M_elems[0] = 5;
    (*pSVar4->_vptr_SPxOut[2])();
    pSVar4 = (this->
             super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).spxout;
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar4->m_streams[pSVar4->m_verbosity],"Row scaling min= ",0x11);
    (*(this->
      super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      )._vptr_SPxScaler[0x31])(&local_1c0,this);
    boost::multiprecision::operator<<(pSVar4->m_streams[pSVar4->m_verbosity],&local_1c0);
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar4->m_streams[pSVar4->m_verbosity]," max= ",6);
    (*(this->
      super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      )._vptr_SPxScaler[0x32])(&local_1f8,this);
    boost::multiprecision::operator<<(pSVar4->m_streams[pSVar4->m_verbosity],&local_1f8);
    cVar9 = (char)pSVar4->m_streams[pSVar4->m_verbosity];
    std::ios::widen((char)*(undefined8 *)(*(long *)pSVar4->m_streams[pSVar4->m_verbosity] + -0x18) +
                    cVar9);
    std::ostream::put(cVar9);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar4->m_streams[pSVar4->m_verbosity],"Col scaling min= ",0x11);
    (*(this->
      super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      )._vptr_SPxScaler[0x2f])(&local_230,this);
    boost::multiprecision::operator<<(pSVar4->m_streams[pSVar4->m_verbosity],&local_230);
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar4->m_streams[pSVar4->m_verbosity]," max= ",6);
    (*(this->
      super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      )._vptr_SPxScaler[0x30])(&local_268,this);
    boost::multiprecision::operator<<(pSVar4->m_streams[pSVar4->m_verbosity],&local_268);
    cVar9 = (char)pSVar4->m_streams[pSVar4->m_verbosity];
    std::ios::widen((char)*(undefined8 *)(*(long *)pSVar4->m_streams[pSVar4->m_verbosity] + -0x18) +
                    cVar9);
    std::ostream::put(cVar9);
    std::ostream::flush();
    pSVar4 = (this->
             super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).spxout;
    (*pSVar4->_vptr_SPxOut[2])(pSVar4,&result_2);
  }
  pSVar4 = (this->
           super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).spxout;
  if ((pSVar4 != (SPxOut *)0x0) && (3 < (int)pSVar4->m_verbosity)) {
    result_2.m_backend.data._M_elems[0] = pSVar4->m_verbosity;
    result_4.m_backend.data._M_elems[0] = 4;
    (*pSVar4->_vptr_SPxOut[2])();
    pSVar4 = (this->
             super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).spxout;
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar4->m_streams[pSVar4->m_verbosity],"after scaling: ",0xf);
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar4->m_streams[pSVar4->m_verbosity]," min= ",6);
    (*(lp->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[3])(&local_2a0,lp,0);
    boost::multiprecision::operator<<(pSVar4->m_streams[pSVar4->m_verbosity],&local_2a0);
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar4->m_streams[pSVar4->m_verbosity]," max= ",6);
    (*(lp->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[4])(&local_2d8,lp,0);
    boost::multiprecision::operator<<(pSVar4->m_streams[pSVar4->m_verbosity],&local_2d8);
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar4->m_streams[pSVar4->m_verbosity]," col-ratio= ",0xc);
    (*(this->
      super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      )._vptr_SPxScaler[0x33])(&local_310,this,lp);
    boost::multiprecision::operator<<(pSVar4->m_streams[pSVar4->m_verbosity],&local_310);
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar4->m_streams[pSVar4->m_verbosity]," row-ratio= ",0xc);
    (*(this->
      super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      )._vptr_SPxScaler[0x34])(&local_348,this,lp);
    boost::multiprecision::operator<<(pSVar4->m_streams[pSVar4->m_verbosity],&local_348);
    cVar9 = (char)pSVar4->m_streams[pSVar4->m_verbosity];
    std::ios::widen((char)*(undefined8 *)(*(long *)pSVar4->m_streams[pSVar4->m_verbosity] + -0x18) +
                    cVar9);
    std::ostream::put(cVar9);
    std::ostream::flush();
    pSVar4 = (this->
             super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).spxout;
    (*pSVar4->_vptr_SPxOut[2])(pSVar4,&result_2);
  }
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::~SSVectorBase(&colnnzinv);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::~SSVectorBase(&rownnzinv);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::~SSVectorBase(&collogs);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::~SSVectorBase(&rowlogs);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::~SSVectorBase(&tmpcols);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::~SSVectorBase(&tmprows);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::~SSVectorBase(&resncols);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::~SSVectorBase(&resnrows);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::~SSVectorBase(&rowscale2);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::~SSVectorBase(&rowscale1);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::~SSVectorBase(&colscale2);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::~SSVectorBase(&colscale1);
  SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::~SVSetBase(&facncols);
  SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::~SVSetBase(&facnrows);
  return;
}

Assistant:

void SPxLeastSqSC<R>::scale(SPxLPBase<R>& lp,  bool persistent)
{
   SPX_MSG_INFO1((*this->spxout), (*this->spxout) << "Least squares LP scaling" <<
                 (persistent ? " (persistent)" : "") << std::endl;)

   this->setup(lp);

   const int nrows = lp.nRows();
   const int ncols = lp.nCols();
   const int lpnnz = lp.nNzos();

   // is contraints matrix empty?
   //todo don't create the scaler in this case!
   if(lpnnz == 0)
   {
      // to keep the invariants, we still need to call this method
      this->applyScaling(lp);

      return;
   }

   assert(nrows > 0 && ncols > 0 && lpnnz > 0);

   /* constant factor matrices;
    * in Curtis-Reid article
    * facnrows equals E^T M^(-1)
    * facncols equals E N^(-1)
    * */
   SVSetBase<R> facnrows(nrows, nrows, 1.1, 1.2);
   SVSetBase<R> facncols(ncols, ncols, 1.1, 1.2);

   /* column scaling factor vectors */
   SSVectorBase<R> colscale1(ncols, this->_tolerances);
   SSVectorBase<R> colscale2(ncols, this->_tolerances);

   /* row scaling factor vectors */
   SSVectorBase<R> rowscale1(nrows, this->_tolerances);
   SSVectorBase<R> rowscale2(nrows, this->_tolerances);

   /* residual vectors */
   SSVectorBase<R> resnrows(nrows, this->_tolerances);
   SSVectorBase<R> resncols(ncols, this->_tolerances);

   /* vectors to store temporary values */
   SSVectorBase<R> tmprows(nrows, this->_tolerances);
   SSVectorBase<R> tmpcols(ncols, this->_tolerances);

   /* vectors storing the row and column sums (respectively) of logarithms of
    *(absolute values of) non-zero elements of left hand matrix of LP
    */
   SSVectorBase<R> rowlogs(nrows, this->_tolerances);
   SSVectorBase<R> collogs(ncols, this->_tolerances);

   /* vectors storing the inverted number of non-zeros in each row and column
    *(respectively) of left hand matrix of LP
    */
   SSVectorBase<R> rownnzinv(nrows, this->_tolerances);
   SSVectorBase<R> colnnzinv(ncols, this->_tolerances);

   /* VectorBase<R> pointers */
   SSVectorBase<R>* csccurr = &colscale1;
   SSVectorBase<R>* cscprev = &colscale2;
   SSVectorBase<R>* rsccurr = &rowscale1;
   SSVectorBase<R>* rscprev = &rowscale2;

   SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "before scaling:"
                 << " min= " << lp.minAbsNzo()
                 << " max= " << lp.maxAbsNzo()
                 << " col-ratio= " << this->maxColRatio(lp)
                 << " row-ratio= " << this->maxRowRatio(lp)
                 << std::endl;)

   /* initialize scalars, vectors and matrices */

   assert(acrcydivisor > 0.0);

   const R smax = lpnnz / acrcydivisor;
   R qcurr = 1.0;
   R qprev = 0.0;

   std::array<R, 3> eprev;
   eprev.fill(0.0);

   initConstVecs(lp.rowSet(), facnrows, rowlogs, rownnzinv, R(this->tolerances()->epsilon()));
   initConstVecs(lp.colSet(), facncols, collogs, colnnzinv, R(this->tolerances()->epsilon()));

   assert(tmprows.isSetup() && tmpcols.isSetup());
   assert(rowscale1.isSetup() && rowscale2.isSetup());
   assert(colscale1.isSetup() && colscale2.isSetup());

   // compute first residual vector r0
   int dummy1 = 0;
   int dummy2 = 0;
   resncols = collogs - tmpcols.assign2product4setup(facnrows, rowlogs, nullptr, nullptr, dummy1,
              dummy2);

   resncols.setup();
   resnrows.setup();

   rowscale1.assignPWproduct4setup(rownnzinv, rowlogs);
   rowscale2 = rowscale1;

   R scurr = resncols * tmpcols.assignPWproduct4setup(colnnzinv, resncols);

   int k;

   /* conjugate gradient loop */
   for(k = 0; k < maxrounds; ++k)
   {
      const R sprev = scurr;

      // termination criterion met?
      if(scurr < smax)
         break;

      // is k even?
      if((k % 2) == 0)
      {
         // not in first iteration?
         if(k != 0)   // true, then update row scaling factor vector
            updateScale(rownnzinv, resnrows, tmprows, rsccurr, rscprev, qcurr, qprev, eprev[1], eprev[2],
                        R(this->tolerances()->epsilon()));

         updateRes(facncols, resncols, resnrows, tmprows, eprev[0], qcurr, R(this->tolerances()->epsilon()));
         scurr = resnrows * tmprows.assignPWproduct4setup(resnrows, rownnzinv);
      }
      else // k is odd
      {
         // update column scaling factor vector
         updateScale(colnnzinv, resncols, tmpcols, csccurr, cscprev, qcurr, qprev, eprev[1], eprev[2],
                     R(this->tolerances()->epsilon()));

         updateRes(facnrows, resnrows, resncols, tmpcols, eprev[0], qcurr, R(this->tolerances()->epsilon()));
         scurr = resncols * tmpcols.assignPWproduct4setup(resncols, colnnzinv);
      }

      // shift eprev entries one to the right
      for(unsigned l = 2; l > 0; --l)
         eprev[l] = eprev[l - 1];

      assert(isNotZero(sprev, R(this->tolerances()->epsilon())));

      eprev[0] = (qcurr * scurr) / sprev;

      const R tmp = qcurr;
      qcurr = 1.0 - eprev[0];
      qprev = tmp;
   }

   if(k > 0 && (k % 2) == 0)
   {
      // update column scaling factor vector
      updateScaleFinal(colnnzinv, resncols, tmpcols, csccurr, cscprev, qprev, eprev[1], eprev[2],
                       R(this->tolerances()->epsilon()));
   }
   else if(k > 0)
   {
      // update row scaling factor vector
      updateScaleFinal(rownnzinv, resnrows, tmprows, rsccurr, rscprev, qprev, eprev[1], eprev[2],
                       R(this->tolerances()->epsilon()));
   }

   /* compute actual scaling factors */

   const SSVectorBase<R>& rowscale = *rsccurr;
   const SSVectorBase<R>& colscale = *csccurr;

   DataArray<int>& colscaleExp = *this->m_activeColscaleExp;
   DataArray<int>& rowscaleExp = *this->m_activeRowscaleExp;

   for(k = 0; k < nrows; ++k)
      rowscaleExp[k] = -int(rowscale[k] + ((rowscale[k] >= 0.0) ? (+0.5) : (-0.5)));

   for(k = 0; k < ncols; ++k)
      colscaleExp[k] = -int(colscale[k] + ((colscale[k] >= 0.0) ? (+0.5) : (-0.5)));

   // scale
   this->applyScaling(lp);

   SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "Row scaling min= " << this->minAbsRowscale()
                 << " max= " << this->maxAbsRowscale()
                 << std::endl
                 << "Col scaling min= " << this->minAbsColscale()
                 << " max= " << this->maxAbsColscale()
                 << std::endl;)

   SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "after scaling: "
                 << " min= " << lp.minAbsNzo(false)
                 << " max= " << lp.maxAbsNzo(false)
                 << " col-ratio= " << this->maxColRatio(lp)
                 << " row-ratio= " << this->maxRowRatio(lp)
                 << std::endl;)
}